

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O0

axbStatus_t axbMemBackendRegister(axbHandle_s *handle,axbMemBackend_s *mem)

{
  axbMemBackend_s **__ptr;
  axbMemBackend_s **ppaVar1;
  ulong local_28;
  size_t i;
  axbMemBackend_s **old_array;
  axbMemBackend_s *mem_local;
  axbHandle_s *handle_local;
  
  if (handle->memBackends_size == handle->memBackends_capacity) {
    __ptr = handle->memBackends;
    handle->memBackends_capacity = handle->memBackends_capacity << 1;
    ppaVar1 = (axbMemBackend_s **)malloc(handle->memBackends_capacity << 3);
    handle->memBackends = ppaVar1;
    for (local_28 = 0; local_28 < handle->memBackends_size; local_28 = local_28 + 1) {
      handle->memBackends[local_28] = __ptr[local_28];
    }
    free(__ptr);
  }
  handle->memBackends[handle->memBackends_size] = mem;
  handle->memBackends_size = handle->memBackends_size + 1;
  return 0;
}

Assistant:

axbStatus_t axbMemBackendRegister(struct axbHandle_s *handle, struct axbMemBackend_s *mem)
{
  // check if there is still room for another backend. If not, resize array:
  if (handle->memBackends_size == handle->memBackends_capacity) {
    struct axbMemBackend_s **old_array = handle->memBackends;
    handle->memBackends_capacity *= 2;
    handle->memBackends = malloc(handle->memBackends_capacity * sizeof(struct axbMemBackend_s *));

    // copy over existing backends:
    for (size_t i=0; i<handle->memBackends_size; ++i) handle->memBackends[i] = old_array[i];
    free(old_array);
  }

  handle->memBackends[handle->memBackends_size] = mem;
  handle->memBackends_size += 1;
  return 0;
}